

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

void xmlFreePatternList(xmlPatternPtr comp)

{
  _xmlPattern *p_Var1;
  xmlPatternPtr cur;
  xmlPatternPtr comp_local;
  
  cur = comp;
  while (cur != (xmlPatternPtr)0x0) {
    p_Var1 = cur->next;
    cur->next = (_xmlPattern *)0x0;
    xmlFreePatternInternal(cur);
    cur = p_Var1;
  }
  return;
}

Assistant:

void
xmlFreePatternList(xmlPatternPtr comp) {
    xmlPatternPtr cur;

    while (comp != NULL) {
	cur = comp;
	comp = comp->next;
	cur->next = NULL;
	xmlFreePatternInternal(cur);
    }
}